

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_wString __thiscall
ON_XMLNode::String(ON_XMLNode *this,bool includeFormatting,bool forceLongFormat,
                  bool sortedProperties)

{
  uint uVar1;
  wchar_t *pwVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  long *plVar3;
  uint in_R8D;
  
  plVar3 = (long *)CONCAT71(in_register_00000031,includeFormatting);
  uVar1 = (**(code **)(*plVar3 + 0xd8))
                    (plVar3,0,0,CONCAT71(in_register_00000011,forceLongFormat) & 0xffffffff,
                     CONCAT71(in_register_00000009,sortedProperties) & 0xffffffff,in_R8D);
  ON_wString::ON_wString((ON_wString *)this);
  pwVar2 = ON_wString::SetLength((ON_wString *)this,(ulong)uVar1);
  if (pwVar2 != (wchar_t *)0x0) {
    uVar1 = (**(code **)(*plVar3 + 0xd8))
                      (plVar3,pwVar2,uVar1 + 1,forceLongFormat,sortedProperties,in_R8D & 0xff);
    ON_wString::SetLength((ON_wString *)this,(ulong)uVar1);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLNode::String(bool includeFormatting, bool forceLongFormat, bool sortedProperties) const
{
  // Pretend to write the node to get the buffer size that needs to be allocated.
  const auto numChars = WriteToStream(nullptr, 0, includeFormatting, forceLongFormat, sortedProperties);

  // Create a buffer of that size inside a string.
  ON_wString s;
  auto* pBuffer = s.SetLength(numChars);
  if (nullptr != pBuffer)
  {
    // Now really write the node to the created buffer.
    const auto finalNumChars = WriteToStream(pBuffer, numChars+1, includeFormatting, forceLongFormat, sortedProperties);
    s.SetLength(finalNumChars); // Also ensures termination.
  }

  return s;
}